

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.hpp
# Opt level: O0

ValueEntryIterator<rsg::IsWritableEntry> * __thiscall
rsg::VariableManager::getBegin<rsg::IsWritableEntry>
          (ValueEntryIterator<rsg::IsWritableEntry> *__return_storage_ptr__,VariableManager *this)

{
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  _Var1;
  bool bVar2;
  reference ppVVar3;
  const_iterator cVar4;
  byte local_61;
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_28;
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_20;
  const_iterator first;
  VariableManager *this_local;
  
  first._M_current = (ValueEntry **)this;
  local_20._M_current =
       (ValueEntry **)
       std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::begin
                 (&this->m_entryCache);
  while( true ) {
    local_28._M_current =
         (ValueEntry **)
         std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::end
                   (&this->m_entryCache);
    bVar2 = __gnu_cxx::operator!=(&local_20,&local_28);
    local_61 = 0;
    if (bVar2) {
      ppVVar3 = __gnu_cxx::
                __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                ::operator*(&local_20);
      bVar2 = IsWritableEntry::operator()((IsWritableEntry *)((long)&this_local + 7),*ppVVar3);
      local_61 = bVar2 ^ 0xff;
    }
    _Var1._M_current = local_20._M_current;
    if ((local_61 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
    ::operator++(&local_20,0);
  }
  cVar4 = std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::end
                    (&this->m_entryCache);
  ValueEntryIterator<rsg::IsWritableEntry>::ValueEntryIterator
            (__return_storage_ptr__,_Var1._M_current,cVar4._M_current);
  return __return_storage_ptr__;
}

Assistant:

ValueEntryIterator<Filter> VariableManager::getBegin (Filter filter) const
{
	std::vector<const ValueEntry*>::const_iterator first = m_entryCache.begin();
	while (first != m_entryCache.end() && !filter(*first))
		first++;
	return ValueEntryIterator<Filter>(first, m_entryCache.end(), filter);
}